

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

ParseInfoTree * __thiscall
google::protobuf::TextFormat::ParseInfoTree::CreateNested
          (ParseInfoTree *this,FieldDescriptor *field)

{
  FieldDescriptor *local_38;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>::iterator,_bool>
  local_30;
  
  local_38 = field;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>>>
  ::try_emplace_impl<google::protobuf::FieldDescriptor_const*const&>
            (&local_30,&this->nested_,&local_38);
  local_30.first.ctrl_ = (ctrl_t *)operator_new(0x40);
  local_30.first.ctrl_[0x10] = ~kSentinel;
  local_30.first.ctrl_[0x11] = ~kSentinel;
  local_30.first.ctrl_[0x12] = ~kSentinel;
  local_30.first.ctrl_[0x13] = ~kSentinel;
  local_30.first.ctrl_[0x14] = ~kSentinel;
  local_30.first.ctrl_[0x15] = ~kSentinel;
  local_30.first.ctrl_[0x16] = ~kSentinel;
  local_30.first.ctrl_[0x17] = ~kSentinel;
  local_30.first.ctrl_[0x18] = ~kSentinel;
  local_30.first.ctrl_[0x19] = ~kSentinel;
  local_30.first.ctrl_[0x1a] = ~kSentinel;
  local_30.first.ctrl_[0x1b] = ~kSentinel;
  local_30.first.ctrl_[0x1c] = ~kSentinel;
  local_30.first.ctrl_[0x1d] = ~kSentinel;
  local_30.first.ctrl_[0x1e] = ~kSentinel;
  local_30.first.ctrl_[0x1f] = ~kSentinel;
  local_30.first.ctrl_[0x30] = ~kSentinel;
  local_30.first.ctrl_[0x31] = ~kSentinel;
  local_30.first.ctrl_[0x32] = ~kSentinel;
  local_30.first.ctrl_[0x33] = ~kSentinel;
  local_30.first.ctrl_[0x34] = ~kSentinel;
  local_30.first.ctrl_[0x35] = ~kSentinel;
  local_30.first.ctrl_[0x36] = ~kSentinel;
  local_30.first.ctrl_[0x37] = ~kSentinel;
  local_30.first.ctrl_[0x38] = ~kSentinel;
  local_30.first.ctrl_[0x39] = ~kSentinel;
  local_30.first.ctrl_[0x3a] = ~kSentinel;
  local_30.first.ctrl_[0x3b] = ~kSentinel;
  local_30.first.ctrl_[0x3c] = ~kSentinel;
  local_30.first.ctrl_[0x3d] = ~kSentinel;
  local_30.first.ctrl_[0x3e] = ~kSentinel;
  local_30.first.ctrl_[0x3f] = ~kSentinel;
  local_30.first.ctrl_[0] = ~kSentinel;
  local_30.first.ctrl_[1] = ~kSentinel;
  local_30.first.ctrl_[2] = ~kSentinel;
  local_30.first.ctrl_[3] = ~kSentinel;
  local_30.first.ctrl_[4] = ~kSentinel;
  local_30.first.ctrl_[5] = ~kSentinel;
  local_30.first.ctrl_[6] = ~kSentinel;
  local_30.first.ctrl_[7] = ~kSentinel;
  local_30.first.ctrl_[8] = ~kSentinel;
  local_30.first.ctrl_[9] = ~kSentinel;
  local_30.first.ctrl_[10] = ~kSentinel;
  local_30.first.ctrl_[0xb] = ~kSentinel;
  local_30.first.ctrl_[0xc] = ~kSentinel;
  local_30.first.ctrl_[0xd] = ~kSentinel;
  local_30.first.ctrl_[0xe] = ~kSentinel;
  local_30.first.ctrl_[0xf] = ~kSentinel;
  local_30.first.ctrl_[0x20] = ~kSentinel;
  local_30.first.ctrl_[0x21] = ~kSentinel;
  local_30.first.ctrl_[0x22] = ~kSentinel;
  local_30.first.ctrl_[0x23] = ~kSentinel;
  local_30.first.ctrl_[0x24] = ~kSentinel;
  local_30.first.ctrl_[0x25] = ~kSentinel;
  local_30.first.ctrl_[0x26] = ~kSentinel;
  local_30.first.ctrl_[0x27] = ~kSentinel;
  local_30.first.ctrl_[0x28] = ~kSentinel;
  local_30.first.ctrl_[0x29] = ~kSentinel;
  local_30.first.ctrl_[0x2a] = ~kSentinel;
  local_30.first.ctrl_[0x2b] = ~kSentinel;
  local_30.first.ctrl_[0x2c] = ~kSentinel;
  local_30.first.ctrl_[0x2d] = ~kSentinel;
  local_30.first.ctrl_[0x2e] = ~kSentinel;
  local_30.first.ctrl_[0x2f] = ~kSentinel;
  local_30.first.ctrl_[0x10] = 0xf0;
  local_30.first.ctrl_[0x11] = 0x6f;
  local_30.first.ctrl_[0x12] = 0x47;
  local_30.first.ctrl_[0x13] = ~kDeleted;
  local_30.first.ctrl_[0x14] = ~kSentinel;
  local_30.first.ctrl_[0x15] = ~kSentinel;
  local_30.first.ctrl_[0x16] = ~kSentinel;
  local_30.first.ctrl_[0x17] = ~kSentinel;
  local_30.first.ctrl_[0x30] = 0xf0;
  local_30.first.ctrl_[0x31] = 0x6f;
  local_30.first.ctrl_[0x32] = 0x47;
  local_30.first.ctrl_[0x33] = ~kDeleted;
  local_30.first.ctrl_[0x34] = ~kSentinel;
  local_30.first.ctrl_[0x35] = ~kSentinel;
  local_30.first.ctrl_[0x36] = ~kSentinel;
  local_30.first.ctrl_[0x37] = ~kSentinel;
  std::
  vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>
  ::emplace_back<google::protobuf::TextFormat::ParseInfoTree*>
            ((vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>
              *)((long)local_30.first.field_1.slot_ + 8),(ParseInfoTree **)&local_30);
  return *(ParseInfoTree **)(*(long *)((long)local_30.first.field_1.slot_ + 0x10) + -8);
}

Assistant:

TextFormat::ParseInfoTree* TextFormat::ParseInfoTree::CreateNested(
    const FieldDescriptor* field) {
  // Owned by us in the map.
  auto& vec = nested_[field];
  vec.emplace_back(new TextFormat::ParseInfoTree());
  return vec.back().get();
}